

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O1

int rsa_encrypt_wrap(void *ctx,uchar *input,size_t ilen,uchar *output,size_t *olen,size_t osize,
                    _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  ulong uVar1;
  int iVar2;
  
  uVar1 = *(ulong *)((long)ctx + 8);
  *olen = uVar1;
  if (osize < uVar1) {
    return -0x4400;
  }
  iVar2 = mbedtls_rsa_pkcs1_encrypt((mbedtls_rsa_context *)ctx,f_rng,p_rng,0,ilen,input,output);
  return iVar2;
}

Assistant:

static int rsa_encrypt_wrap( void *ctx,
                    const unsigned char *input, size_t ilen,
                    unsigned char *output, size_t *olen, size_t osize,
                    int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    *olen = ((mbedtls_rsa_context *) ctx)->len;

    if( *olen > osize )
        return( MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE );

    return( mbedtls_rsa_pkcs1_encrypt( (mbedtls_rsa_context *) ctx,
                f_rng, p_rng, MBEDTLS_RSA_PUBLIC, ilen, input, output ) );
}